

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall
libcellml::ComponentEntity::replaceComponent
          (ComponentEntity *this,size_t index,ComponentPtr *newComponent)

{
  EntityImpl *pEVar1;
  bool bVar2;
  ComponentImpl *this_00;
  ParentedEntityPtr parent;
  ComponentPtr oldComponent;
  __shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2> local_48;
  ComponentEntity local_38;
  
  component(&local_38,(size_t)this);
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_38.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity != (_func_int **)0x0
     ) {
    ParentedEntity::parent((ParentedEntity *)&local_48);
    std::__shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  bVar2 = removeComponent(this,index);
  if (bVar2) {
    pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::insert((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              *)&pEVar1[2].mId.field_2,
             (shared_ptr<libcellml::Component> *)
             (index * 0x10 + pEVar1[2].mId.field_2._M_allocated_capacity),newComponent);
    this_00 = Component::pFunc((newComponent->
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
    ParentedEntity::ParentedEntityImpl::setParent
              ((ParentedEntityImpl *)this_00,(ParentedEntityPtr *)&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
  return bVar2;
}

Assistant:

bool ComponentEntity::replaceComponent(size_t index, const ComponentPtr &newComponent)
{
    bool status = false;
    auto oldComponent = component(index);
    ParentedEntityPtr parent = nullptr;
    if (oldComponent != nullptr) {
        parent = oldComponent->parent();
    }

    if (removeComponent(index)) {
        pFunc()->mComponents.insert(pFunc()->mComponents.begin() + ptrdiff_t(index), newComponent);
        newComponent->pFunc()->setParent(parent);
        status = true;
    }

    return status;
}